

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O1

void pnga_scale(Integer g_a,void *alpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  Integer grp_id;
  Integer proc;
  Integer IVar8;
  logical lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  Integer elems;
  void *ptr;
  Integer type;
  Integer ndim;
  Integer _lo [7];
  Integer _hi [7];
  Integer _ld [6];
  Integer _dims [7];
  long local_138;
  undefined1 (*local_130) [16];
  Integer local_128;
  long local_120 [9];
  Integer local_d8 [8];
  Integer local_98 [6];
  Integer local_68 [7];
  
  iVar7 = _ga_sync_end;
  iVar6 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  grp_id = pnga_get_pgroup(g_a);
  if (iVar6 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  proc = pnga_pgroup_nodeid(grp_id);
  pnga_check_handle(g_a,"ga_scale");
  IVar8 = pnga_total_blocks(g_a);
  pnga_inquire(g_a,&local_128,local_120,local_68);
  if (IVar8 < 0) {
    pnga_distribution(g_a,proc,local_120 + 1,local_d8);
    lVar9 = pnga_has_ghosts(g_a);
    if (lVar9 != 0) {
      pnga_scale_patch(g_a,local_120 + 1,local_d8,alpha);
      return;
    }
    if (0 < local_120[1]) {
      pnga_access_ptr(g_a,local_120 + 1,local_d8,&local_130,local_98);
      local_138 = (local_d8[local_120[0] + -1] - local_120[local_120[0]]) + 1;
      if (1 < local_120[0]) {
        lVar10 = 0;
        do {
          if (local_98[lVar10] != (local_d8[lVar10] - local_120[lVar10 + 1]) + 1) {
            pnga_error("layout problem",lVar10);
          }
          local_138 = ((local_d8[lVar10] - local_120[lVar10 + 1]) + 1) * local_138;
          lVar10 = lVar10 + 1;
        } while (lVar10 < local_120[0] + -1);
      }
      switch(local_128) {
      case 0x3e9:
        if (0 < local_138) {
          lVar10 = 0;
          do {
            *(int *)(*local_130 + lVar10 * 4) = *(int *)(*local_130 + lVar10 * 4) * *alpha;
            lVar10 = lVar10 + 1;
          } while (local_138 != lVar10);
        }
        break;
      case 0x3ea:
        if (0 < local_138) {
          lVar10 = 0;
          do {
            *(long *)(*local_130 + lVar10 * 8) = *(long *)(*local_130 + lVar10 * 8) * *alpha;
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_138);
        }
        break;
      case 0x3eb:
        if (0 < local_138) {
          lVar10 = 0;
          do {
            *(float *)(*local_130 + lVar10 * 4) = *alpha * *(float *)(*local_130 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (local_138 != lVar10);
        }
        break;
      case 0x3ec:
        if (0 < local_138) {
          lVar10 = 0;
          do {
            *(double *)(*local_130 + lVar10 * 8) = *alpha * *(double *)(*local_130 + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (local_138 != lVar10);
        }
        break;
      default:
        pnga_error(" wrong data type ",local_128);
        break;
      case 0x3ee:
        if (0 < local_138) {
          lVar10 = 0;
          fVar11 = (float)*alpha;
          fVar12 = (float)((ulong)*alpha >> 0x20);
          do {
            *(ulong *)(*local_130 + lVar10 * 8) =
                 CONCAT44(*(float *)(*local_130 + lVar10 * 8) * fVar12 +
                          *(float *)(*local_130 + lVar10 * 8 + 4) * fVar11,
                          *(float *)(*local_130 + lVar10 * 8) * fVar11 +
                          -*(float *)(*local_130 + lVar10 * 8 + 4) * fVar12);
            lVar10 = lVar10 + 1;
          } while (local_138 != lVar10);
        }
        break;
      case 0x3ef:
        if (0 < local_138) {
          dVar4 = *alpha;
          dVar5 = *(double *)((long)alpha + 8);
          lVar10 = local_138;
          do {
            dVar3 = *(double *)*local_130 * dVar5 + *(double *)(*local_130 + 8) * dVar4;
            auVar2._8_4_ = SUB84(dVar3,0);
            auVar2._0_8_ = *(double *)*local_130 * dVar4 + -*(double *)(*local_130 + 8) * dVar5;
            auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
            *local_130 = auVar2;
            local_130 = local_130 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        break;
      case 0x3f8:
        if (0 < local_138) {
          lVar10 = 0;
          do {
            *(long *)(*local_130 + lVar10 * 8) = *(long *)(*local_130 + lVar10 * 8) * *alpha;
            lVar10 = lVar10 + 1;
          } while (local_138 != lVar10);
        }
      }
      pnga_release_update(g_a,local_120 + 1,local_d8);
    }
  }
  else {
    pnga_access_block_segment_ptr(g_a,proc,&local_130,&local_138);
    switch(local_128) {
    case 0x3e9:
      if (0 < local_138) {
        lVar10 = 0;
        do {
          *(int *)(*local_130 + lVar10 * 4) = *(int *)(*local_130 + lVar10 * 4) * *alpha;
          lVar10 = lVar10 + 1;
        } while (local_138 != lVar10);
      }
      break;
    case 0x3ea:
      if (0 < local_138) {
        lVar10 = 0;
        do {
          *(long *)(*local_130 + lVar10 * 8) = *(long *)(*local_130 + lVar10 * 8) * *alpha;
          lVar10 = lVar10 + 1;
        } while (lVar10 < local_138);
      }
      break;
    case 0x3eb:
      if (0 < local_138) {
        lVar10 = 0;
        do {
          *(float *)(*local_130 + lVar10 * 4) = *alpha * *(float *)(*local_130 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (local_138 != lVar10);
      }
      break;
    case 0x3ec:
      if (0 < local_138) {
        lVar10 = 0;
        do {
          *(double *)(*local_130 + lVar10 * 8) = *alpha * *(double *)(*local_130 + lVar10 * 8);
          lVar10 = lVar10 + 1;
        } while (local_138 != lVar10);
      }
      break;
    default:
      pnga_error(" wrong data type ",local_128);
      break;
    case 0x3ee:
      if (0 < local_138) {
        lVar10 = 0;
        fVar11 = (float)*alpha;
        fVar12 = (float)((ulong)*alpha >> 0x20);
        do {
          *(ulong *)(*local_130 + lVar10 * 8) =
               CONCAT44(*(float *)(*local_130 + lVar10 * 8) * fVar12 +
                        *(float *)(*local_130 + lVar10 * 8 + 4) * fVar11,
                        *(float *)(*local_130 + lVar10 * 8) * fVar11 +
                        -*(float *)(*local_130 + lVar10 * 8 + 4) * fVar12);
          lVar10 = lVar10 + 1;
        } while (local_138 != lVar10);
      }
      break;
    case 0x3ef:
      if (0 < local_138) {
        dVar4 = *alpha;
        dVar5 = *(double *)((long)alpha + 8);
        lVar10 = local_138;
        do {
          dVar3 = *(double *)*local_130 * dVar5 + *(double *)(*local_130 + 8) * dVar4;
          auVar1._8_4_ = SUB84(dVar3,0);
          auVar1._0_8_ = *(double *)*local_130 * dVar4 + -*(double *)(*local_130 + 8) * dVar5;
          auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
          *local_130 = auVar1;
          local_130 = local_130 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      break;
    case 0x3f8:
      if (0 < local_138) {
        lVar10 = 0;
        do {
          *(long *)(*local_130 + lVar10 * 8) = *(long *)(*local_130 + lVar10 * 8) * *alpha;
          lVar10 = lVar10 + 1;
        } while (local_138 != lVar10);
      }
    }
    pnga_release_update_block_segment(g_a,proc);
  }
  if (iVar7 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_scale(Integer g_a, void* alpha)
{
  Integer ndim, type, me, elems, grp_id;
  register Integer i;
  Integer num_blocks;
  void *ptr;
  int local_sync_begin,local_sync_end;
  Integer _dims[MAXDIM];
  Integer _ld[MAXDIM-1];
  Integer _lo[MAXDIM];
  Integer _hi[MAXDIM];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);

  me = pnga_pgroup_nodeid(grp_id);

  pnga_check_handle(g_a, "ga_scale");
  num_blocks = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, _dims);
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, _lo, _hi);
    if (pnga_has_ghosts(g_a)) {
      pnga_scale_patch(g_a, _lo, _hi, alpha);
      return;
    }

    if ( _lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      pnga_access_ptr(g_a, _lo, _hi, &ptr, _ld);
      GET_ELEMS(ndim,_lo,_hi,_ld,&elems);

      switch (type){
        int *ia;
        double *da;
        DoubleComplex *ca, scale;
        SingleComplex *cfa, cfscale;
        long *la;
        long long *lla;
        float *fa;
        case C_INT:
        ia = (int*)ptr;
        for(i=0;i<elems;i++) ia[i]  *= *(int*)alpha;
        break;
        case C_LONG:
        la = (long*)ptr;
        for(i=0;i<elems;i++) la[i]  *= *(long*)alpha;
        break;
        case C_LONGLONG:
        lla = (long long*)ptr;
        for(i=0;i<elems;i++) lla[i]  *= *(long long*)alpha;
        break;
        case C_DCPL:
        ca = (DoubleComplex*)ptr;
        scale= *(DoubleComplex*)alpha;
        for(i=0;i<elems;i++){
          DoubleComplex val = ca[i]; 
          ca[i].real = scale.real*val.real  - val.imag * scale.imag;
          ca[i].imag = scale.imag*val.real  + val.imag * scale.real;
        }
        break;
        case C_SCPL:
        cfa = (SingleComplex*)ptr;
        cfscale= *(SingleComplex*)alpha;
        for(i=0;i<elems;i++){
          SingleComplex val = cfa[i]; 
          cfa[i].real = cfscale.real*val.real  - val.imag * cfscale.imag;
          cfa[i].imag = cfscale.imag*val.real  + val.imag * cfscale.real;
        }
        break;
        case C_DBL:
        da = (double*)ptr;
        for(i=0;i<elems;i++) da[i] *= *(double*)alpha;
        break;
        case C_FLOAT:
        fa = (float*)ptr;
        for(i=0;i<elems;i++) fa[i]  *= *(float*)alpha;
        break;       
        default: pnga_error(" wrong data type ",type);
      }

      /* release access to the data */
      pnga_release_update(g_a, _lo, _hi);
    }
  } else {
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
    switch (type){
      int *ia;
      double *da;
      DoubleComplex *ca, scale;
      SingleComplex *cfa, cfscale;
      long *la;
      long long *lla;
      float *fa;
      case C_INT:
      ia = (int*)ptr;
      for(i=0;i<elems;i++) ia[i]  *= *(int*)alpha;
      break;
      case C_LONG:
      la = (long*)ptr;
      for(i=0;i<elems;i++) la[i]  *= *(long*)alpha;
      break;
      case C_LONGLONG:
      lla = (long long*)ptr;
      for(i=0;i<elems;i++) lla[i]  *= *(long long*)alpha;
      break;
      case C_DCPL:
      ca = (DoubleComplex*)ptr;
      scale= *(DoubleComplex*)alpha;
      for(i=0;i<elems;i++){
        DoubleComplex val = ca[i]; 
        ca[i].real = scale.real*val.real  - val.imag * scale.imag;
        ca[i].imag = scale.imag*val.real  + val.imag * scale.real;
      }
      break;
      case C_SCPL:
      cfa = (SingleComplex*)ptr;
      cfscale= *(SingleComplex*)alpha;
      for(i=0;i<elems;i++){
        SingleComplex val = cfa[i]; 
        cfa[i].real = cfscale.real*val.real  - val.imag * cfscale.imag;
        cfa[i].imag = cfscale.imag*val.real  + val.imag * cfscale.real;
      }
      break;
      case C_DBL:
      da = (double*)ptr;
      for(i=0;i<elems;i++) da[i] *= *(double*)alpha;
      break;
      case C_FLOAT:
      fa = (float*)ptr;
      for(i=0;i<elems;i++) fa[i]  *= *(float*)alpha;
      break;       
      default: pnga_error(" wrong data type ",type);
    }
    /* release access to the data */
    pnga_release_update_block_segment(g_a, me);
  }
  if(local_sync_end)pnga_pgroup_sync(grp_id); 
}